

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image * rf_image_copy(rf_image *__return_storage_ptr__,rf_image image,rf_allocator allocator)

{
  rf_source_location source_location;
  int iVar1;
  long lVar2;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 uVar3;
  long lVar4;
  undefined4 uStack_c4;
  undefined4 uStack_8c;
  rf_image local_70;
  undefined8 local_58;
  long local_50;
  undefined4 local_48;
  uint uStack_44;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  void *local_28;
  void *dst;
  void *pvStack_18;
  int size;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  pvStack_18 = allocator.user_data;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b2891,(char *)0x1);
    lVar4 = *in_FS_OFFSET;
    *(char **)(lVar4 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar4 + -0x458) = "rf_image_copy";
    *(undefined8 *)(lVar4 + -0x450) = 0x3d79;
    *(ulong *)(lVar4 + -0x448) = CONCAT44(uStack_c4,1);
  }
  else {
    iVar1 = rf_bytes_per_pixel(image.format);
    dst._4_4_ = image.width * image.height * iVar1;
    local_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    local_38 = "rf_image_copy";
    local_30 = 0x3d71;
    local_58 = 0;
    lVar2 = (long)(int)dst._4_4_;
    local_48 = 0;
    uVar3 = 0;
    lVar4 = (ulong)uStack_44 << 0x20;
    local_50 = lVar2;
    local_28 = (void *)(*(code *)allocator_local.user_data)(&stack0xffffffffffffffe8,1);
    if (local_28 == (void *)0x0) {
      source_location.proc_name = "rf_image_copy";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3d77;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Failed to allocate %d bytes",2,(ulong)dst._4_4_
                  ,"rf_image_copy",in_R9,uVar3,lVar2,lVar4);
      lVar4 = *in_FS_OFFSET;
      *(char **)(lVar4 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar4 + -0x458) = "rf_image_copy";
      *(undefined8 *)(lVar4 + -0x450) = 0x3d77;
      *(ulong *)(lVar4 + -0x448) = CONCAT44(uStack_8c,2);
    }
    else {
      rf_image_copy_to_buffer(&local_70,image,local_28,(long)(int)dst._4_4_);
      __return_storage_ptr__->data = local_70.data;
      __return_storage_ptr__->width = local_70.width;
      __return_storage_ptr__->height = local_70.height;
      __return_storage_ptr__->format = local_70.format;
      __return_storage_ptr__->valid = local_70.valid;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_70._21_3_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_copy(rf_image image, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        int size  = image.width * image.height * rf_bytes_per_pixel(image.format);
        void* dst = RF_ALLOC(allocator, size);

        if (dst)
        {
            result = rf_image_copy_to_buffer(image, dst, size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Failed to allocate %d bytes", size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image was invalid.");

    return result;
}